

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O2

spv_result_t spvtools::val::InstructionPass(ValidationState_t *_,Instruction *inst)

{
  spv_parsed_operand_t *operand;
  uint16_t uVar1;
  pointer psVar2;
  pointer puVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  uint32_t uVar7;
  ExecutionMode EVar8;
  Capability cap;
  StorageClass SVar9;
  AddressingModel am;
  MemoryModel mm;
  spv_result_t sVar10;
  DiagnosticStream *pDVar11;
  Instruction *pIVar12;
  spv_parsed_instruction_t *in_RDX;
  Extension *extension_00;
  ExtensionSet *extensions;
  ExtensionSet *extensions_00;
  char *pcVar13;
  ulong uVar14;
  uint32_t mask_bit;
  Op OVar15;
  uint uVar16;
  string extension_str;
  spv_opcode_desc inst_desc_1;
  Extension extension;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 10:
    GetExtensionString_abi_cxx11_(&extension_str,(spvtools *)&inst->inst_,in_RDX);
    bVar4 = GetExtensionFromString
                      ((spvtools *)extension_str._M_dataplus._M_p,(char *)&extension,extension_00);
    if (!bVar4) {
      ValidationState_t::diag(&local_208,_,SPV_WARNING,inst);
      std::operator<<((ostream *)&local_208,"Found unrecognized extension ");
      std::operator<<((ostream *)&local_208,(string *)&extension_str);
      DiagnosticStream::~DiagnosticStream(&local_208);
    }
    std::__cxx11::string::_M_dispose();
    break;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xf:
    break;
  case 0xe:
    if ((_->addressing_model_ != AddressingModelMax) && (_->memory_model_ != Max)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar13 = "OpMemoryModel should only be provided once.";
      goto LAB_00589e9d;
    }
    am = Instruction::GetOperandAs<spv::AddressingModel>(inst,0);
    ValidationState_t::set_addressing_model(_,am);
    mm = Instruction::GetOperandAs<spv::MemoryModel>(inst,1);
    ValidationState_t::set_memory_model(_,mm);
    break;
  case 0x10:
switchD_00589bf5_caseD_10:
    puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = puVar3[1];
    ValidationState_t::RegisterExecutionModeForEntryPoint(_,uVar7,puVar3[2]);
    EVar8 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
    if ((EVar8 == ExecutionModeLocalSize) ||
       (EVar8 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1),
       EVar8 == ExecutionModeLocalSizeId)) {
      ValidationState_t::RegisterEntryPointLocalSize(_,uVar7,inst);
    }
    EVar8 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
    if (EVar8 == ExecutionModeOutputPrimitivesEXT) {
      ValidationState_t::RegisterEntryPointOutputPrimitivesEXT(_,uVar7,inst);
    }
    break;
  case 0x11:
    cap = Instruction::GetOperandAs<spv::Capability>(inst,0);
    ValidationState_t::RegisterCapability(_,cap);
    break;
  default:
    if (uVar1 == 0x3b) {
      SVar9 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
      uVar7 = (inst->inst_).result_id;
      if (SVar9 == Function) {
        ValidationState_t::registerLocalVariable(_,uVar7);
        if ((ulong)(_->options_->universal_limits_).max_local_variables <
            (_->local_vars_)._M_h._M_element_count) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
          pcVar13 = 
          "Number of local variables (\'Function\' Storage Class) exceeded the valid limit (";
LAB_00589e43:
          std::operator<<((ostream *)&local_208,pcVar13);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          std::operator<<((ostream *)&local_208,").");
          sVar10 = local_208.error_;
          DiagnosticStream::~DiagnosticStream(&local_208);
          if (sVar10 != SPV_SUCCESS) {
            return sVar10;
          }
        }
      }
      else {
        ValidationState_t::registerGlobalVariable(_,uVar7);
        if ((ulong)(_->options_->universal_limits_).max_global_variables <
            (_->global_vars_)._M_h._M_element_count) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
          pcVar13 = 
          "Number of Global Variables (Storage Class other than \'Function\') exceeded the valid limit ("
          ;
          goto LAB_00589e43;
        }
      }
    }
    else {
      if (uVar1 == 0x14b) goto switchD_00589bf5_caseD_10;
      if (uVar1 == 0x1515) {
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,BindlessTextureNV);
        if (!bVar4) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_MISSING_EXTENSION,inst);
          pcVar13 = 
          "OpSamplerImageAddressingModeNV supported only with extension SPV_NV_bindless_texture";
LAB_00589e9d:
          std::operator<<((ostream *)&local_208,pcVar13);
          DiagnosticStream::~DiagnosticStream(&local_208);
          return local_208.error_;
        }
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        uVar7 = ValidationState_t::samplerimage_variable_address_mode(_);
        if (uVar7 != 0) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
          pcVar13 = "OpSamplerImageAddressingModeNV should only be provided once";
          goto LAB_00589e9d;
        }
        if ((uVar6 != 0x20) && (uVar6 != 0x40)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar13 = "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32";
          goto LAB_00589e9d;
        }
        ValidationState_t::set_samplerimage_variable_address_mode(_,uVar6);
      }
    }
  }
  uVar5 = (inst->inst_).opcode;
  OVar15 = (Op)uVar5;
  if (uVar5 - 0x135 < 4) {
    AssemblyGrammar::lookupOpcode(&_->grammar_,OVar15,(spv_opcode_desc *)&extension_str);
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::operator<<((ostream *)&local_208,"Invalid Opcode name \'Op");
    pDVar11 = DiagnosticStream::operator<<(&local_208,(char **)extension_str._M_dataplus._M_p);
    std::operator<<((ostream *)pDVar11,"\'");
    sVar10 = pDVar11->error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar10 != SPV_SUCCESS) {
      return sVar10;
    }
    OVar15 = (Op)(inst->inst_).opcode;
  }
  if (((OVar15 & ~OpString) == OpGroupIAddNonUniformAMD) &&
     (bVar4 = EnumSet<spvtools::Extension>::contains(&_->module_extensions_,kSPV_AMD_shader_ballot),
     bVar4)) {
LAB_00589f99:
    EnumSet<spv::Capability>::EnumSet((EnumSet<spv::Capability> *)&extension_str);
  }
  else {
    local_208._0_8_ = 0;
    sVar10 = AssemblyGrammar::lookupOpcode(&_->grammar_,OVar15,(spv_opcode_desc *)&local_208);
    if (sVar10 != SPV_SUCCESS) goto LAB_00589f99;
    AssemblyGrammar::filterCapsAgainstTargetEnv
              ((CapabilitySet *)&extension_str,&_->grammar_,*(Capability **)(local_208._0_8_ + 0x20)
               ,*(uint32_t *)(local_208._0_8_ + 0x18));
  }
  bVar4 = ValidationState_t::HasAnyOfCapabilities(_,(CapabilitySet *)&extension_str);
  if (bVar4) {
    uVar14 = 0;
    do {
      while( true ) {
        psVar2 = (inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar14)
        {
          sVar10 = SPV_SUCCESS;
          goto LAB_0058a0f7;
        }
        operand = psVar2 + uVar14;
        uVar6 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[psVar2[uVar14].offset];
        bVar4 = spvOperandIsConcreteMask(psVar2[uVar14].type);
        if (!bVar4) break;
        uVar14 = uVar14 + 1;
        for (uVar16 = 0x80000000; uVar16 != 0; uVar16 = uVar16 >> 1) {
          if (((uVar16 & uVar6) != 0) &&
             (sVar10 = anon_unknown_1::CheckRequiredCapabilities(_,inst,uVar14,operand,uVar16),
             sVar10 != SPV_SUCCESS)) goto LAB_0058a0f7;
        }
      }
      bVar4 = spvIsIdType(operand->type);
      uVar14 = uVar14 + 1;
    } while ((bVar4) ||
            (sVar10 = anon_unknown_1::CheckRequiredCapabilities(_,inst,uVar14,operand,uVar6),
            sVar10 == SPV_SUCCESS));
  }
  else {
    pIVar12 = inst;
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
    std::operator<<((ostream *)&local_208,"Opcode ");
    pcVar13 = spvOpcodeString(OVar15);
    std::operator<<((ostream *)&local_208,pcVar13);
    std::operator<<((ostream *)&local_208," requires one of these capabilities: ");
    (anonymous_namespace)::ToString_abi_cxx11_
              ((string *)&extension,(_anonymous_namespace_ *)&extension_str,
               (CapabilitySet *)&_->grammar_,(AssemblyGrammar *)pIVar12);
    std::operator<<((ostream *)&local_208,(string *)&extension);
    sVar10 = local_208.error_;
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
LAB_0058a0f7:
  std::
  _Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   *)&extension_str);
  if (sVar10 != SPV_SUCCESS) {
    return sVar10;
  }
  uVar6 = (inst->inst_).result_id;
  uVar7 = ValidationState_t::getIdBound(_);
  if (uVar7 <= uVar6) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::operator<<((ostream *)&local_208,"Result <id> \'");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,"\' must be less than the ID bound \'");
    ValidationState_t::getIdBound(_);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,"\'.");
    sVar10 = local_208.error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar10 != SPV_SUCCESS) {
      return sVar10;
    }
  }
  uVar5 = (inst->inst_).opcode;
  if (uVar5 == 0x1e) {
    uVar5 = (ushort)(_->options_->universal_limits_).max_struct_members;
    if ((ulong)uVar5 <
        ((long)(inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
      std::operator<<((ostream *)&local_208,"Number of OpTypeStruct members (");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208,") has exceeded the limit (");
      std::ostream::operator<<(&local_208,uVar5);
      pcVar13 = ").";
LAB_0058a2d8:
      std::operator<<((ostream *)&local_208,pcVar13);
      sVar10 = local_208.error_;
      DiagnosticStream::~DiagnosticStream(&local_208);
      if (sVar10 != SPV_SUCCESS) {
        return sVar10;
      }
    }
    else {
      uVar6 = 0;
      for (uVar14 = 2;
          puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          uVar14 < (ulong)((long)(inst->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
          uVar14 = uVar14 + 1) {
        pIVar12 = ValidationState_t::FindDef(_,puVar3[uVar14]);
        if (((pIVar12 != (Instruction *)0x0) && ((pIVar12->inst_).opcode == 0x1e)) &&
           (uVar7 = ValidationState_t::struct_nesting_depth(_,(pIVar12->inst_).result_id),
           uVar6 <= uVar7)) {
          uVar6 = uVar7;
        }
      }
      uVar16 = (_->options_->universal_limits_).max_struct_depth;
      ValidationState_t::set_struct_nesting_depth(_,(inst->inst_).result_id,uVar6 + 1);
      if (uVar16 < uVar6 + 1) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
        std::operator<<((ostream *)&local_208,"Structure Nesting Depth may not be larger than ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::operator<<((ostream *)&local_208,". Found ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar13 = ".";
        goto LAB_0058a2d8;
      }
    }
    uVar5 = (inst->inst_).opcode;
  }
  if ((uVar5 == 0xfb) &&
     (uVar5 = 0xfb,
     (ulong)(_->options_->universal_limits_).max_switch_branches <
     ((long)(inst->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(inst->operands_).
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start >> 4) - 2U >> 1)) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::operator<<((ostream *)&local_208,"Number of (literal, label) pairs in OpSwitch (");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,") exceeds the limit (");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,").");
    sVar10 = local_208.error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar10 != SPV_SUCCESS) {
      return sVar10;
    }
    uVar5 = (inst->inst_).opcode;
  }
  sVar10 = AssemblyGrammar::lookupOpcode(&_->grammar_,(uint)uVar5,&inst_desc_1);
  if (sVar10 != SPV_SUCCESS) {
    __assert_fail("r == SPV_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_instruction.cpp"
                  ,0x119,
                  "spv_result_t spvtools::val::(anonymous namespace)::VersionCheck(ValidationState_t &, const Instruction *)"
                 );
  }
  uVar6 = _->version_;
  OVar15 = (Op)uVar5;
  if (inst_desc_1->lastVersion < uVar6) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
    pcVar13 = spvOpcodeString(OVar15);
    std::operator<<((ostream *)&local_208,pcVar13);
    std::operator<<((ostream *)&local_208," requires SPIR-V version ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208,".");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208," or earlier");
    DiagnosticStream::~DiagnosticStream(&local_208);
    return local_208.error_;
  }
  uVar16 = inst_desc_1->minVersion;
  if (((inst->inst_).opcode != 0x1140) && (inst_desc_1->numCapabilities != 0)) {
    return SPV_SUCCESS;
  }
  EnumSet<spvtools::Extension>::EnumSet
            ((EnumSet<spvtools::Extension> *)&extension_str,inst_desc_1->numExtensions,
             inst_desc_1->extensions);
  if (extension_str.field_2._8_8_ == 0) {
    if (uVar16 == 0xffffffff) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      pcVar13 = spvOpcodeString((uint)uVar5);
      std::operator<<((ostream *)&local_208,pcVar13);
      std::operator<<((ostream *)&local_208," is reserved for future use.");
      sVar10 = local_208.error_;
    }
    else {
      sVar10 = SPV_SUCCESS;
      if (uVar16 <= uVar6) goto LAB_0058a6ec;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      pcVar13 = spvOpcodeString(OVar15);
      std::operator<<((ostream *)&local_208,pcVar13);
      std::operator<<((ostream *)&local_208," requires SPIR-V version ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208,".");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208," at minimum.");
      sVar10 = local_208.error_;
    }
  }
  else {
    bVar4 = ValidationState_t::HasAnyOfExtensions(_,(ExtensionSet *)&extension_str);
    sVar10 = SPV_SUCCESS;
    if (bVar4) goto LAB_0058a6ec;
    if (uVar16 == 0xffffffff) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_MISSING_EXTENSION,inst);
      pcVar13 = spvOpcodeString(OVar15);
      std::operator<<((ostream *)&local_208,pcVar13);
      std::operator<<((ostream *)&local_208," requires one of the following extensions: ");
      ExtensionSetToString_abi_cxx11_((string *)&extension,(spvtools *)&extension_str,extensions_00)
      ;
      std::operator<<((ostream *)&local_208,(string *)&extension);
      std::__cxx11::string::_M_dispose();
      sVar10 = local_208.error_;
    }
    else {
      if (uVar16 <= uVar6) goto LAB_0058a6ec;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_WRONG_VERSION,inst);
      pcVar13 = spvOpcodeString(OVar15);
      std::operator<<((ostream *)&local_208,pcVar13);
      std::operator<<((ostream *)&local_208," requires SPIR-V version ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208,".");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208," at minimum or one of the following extensions: ");
      ExtensionSetToString_abi_cxx11_((string *)&extension,(spvtools *)&extension_str,extensions);
      std::operator<<((ostream *)&local_208,(string *)&extension);
      std::__cxx11::string::_M_dispose();
      sVar10 = local_208.error_;
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_0058a6ec:
  std::
  _Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                   *)&extension_str);
  return sVar10;
}

Assistant:

spv_result_t InstructionPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (opcode == spv::Op::OpExtension) {
    CheckIfKnownExtension(_, inst);
  } else if (opcode == spv::Op::OpCapability) {
    _.RegisterCapability(inst->GetOperandAs<spv::Capability>(0));
  } else if (opcode == spv::Op::OpMemoryModel) {
    if (_.has_memory_model_specified()) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpMemoryModel should only be provided once.";
    }
    _.set_addressing_model(inst->GetOperandAs<spv::AddressingModel>(0));
    _.set_memory_model(inst->GetOperandAs<spv::MemoryModel>(1));
  } else if (opcode == spv::Op::OpExecutionMode ||
             opcode == spv::Op::OpExecutionModeId) {
    const uint32_t entry_point = inst->word(1);
    _.RegisterExecutionModeForEntryPoint(entry_point,
                                         spv::ExecutionMode(inst->word(2)));
    if (inst->GetOperandAs<spv::ExecutionMode>(1) ==
            spv::ExecutionMode::LocalSize ||
        inst->GetOperandAs<spv::ExecutionMode>(1) ==
            spv::ExecutionMode::LocalSizeId) {
      _.RegisterEntryPointLocalSize(entry_point, inst);
    }
    if (inst->GetOperandAs<spv::ExecutionMode>(1) ==
        spv::ExecutionMode::OutputPrimitivesEXT) {
      _.RegisterEntryPointOutputPrimitivesEXT(entry_point, inst);
    }
  } else if (opcode == spv::Op::OpVariable) {
    const auto storage_class = inst->GetOperandAs<spv::StorageClass>(2);
    if (auto error = LimitCheckNumVars(_, inst->id(), storage_class)) {
      return error;
    }
  } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
    if (!_.HasCapability(spv::Capability::BindlessTextureNV)) {
      return _.diag(SPV_ERROR_MISSING_EXTENSION, inst)
             << "OpSamplerImageAddressingModeNV supported only with extension "
                "SPV_NV_bindless_texture";
    }
    uint32_t bitwidth = inst->GetOperandAs<uint32_t>(0);
    if (_.samplerimage_variable_address_mode() != 0) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpSamplerImageAddressingModeNV should only be provided once";
    }
    if (bitwidth != 32 && bitwidth != 64) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32";
    }
    _.set_samplerimage_variable_address_mode(bitwidth);
  }

  if (auto error = ReservedCheck(_, inst)) return error;
  if (auto error = CapabilityCheck(_, inst)) return error;
  if (auto error = LimitCheckIdBound(_, inst)) return error;
  if (auto error = LimitCheckStruct(_, inst)) return error;
  if (auto error = LimitCheckSwitch(_, inst)) return error;
  if (auto error = VersionCheck(_, inst)) return error;

  // All instruction checks have passed.
  return SPV_SUCCESS;
}